

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzdecomp.cpp
# Opt level: O2

void __thiscall
lzham::lzham_decompressor::reset_huffman_table_update_rates(lzham_decompressor *this)

{
  long lVar1;
  
  quasi_adaptive_huffman_data_model::reset_update_rate(&this->m_lit_table);
  quasi_adaptive_huffman_data_model::reset_update_rate(&this->m_delta_lit_table);
  quasi_adaptive_huffman_data_model::reset_update_rate(&this->m_main_table);
  for (lVar1 = 0; lVar1 != 0x120; lVar1 = lVar1 + 0x90) {
    quasi_adaptive_huffman_data_model::reset_update_rate
              ((quasi_adaptive_huffman_data_model *)(&this->field_0x318 + lVar1));
  }
  for (lVar1 = 0; lVar1 != 0x120; lVar1 = lVar1 + 0x90) {
    quasi_adaptive_huffman_data_model::reset_update_rate
              ((quasi_adaptive_huffman_data_model *)(&this->field_0x438 + lVar1));
  }
  quasi_adaptive_huffman_data_model::reset_update_rate(&this->m_dist_lsb_table);
  return;
}

Assistant:

void lzham_decompressor::reset_huffman_table_update_rates()
   {
      m_lit_table.reset_update_rate();
      m_delta_lit_table.reset_update_rate();

      m_main_table.reset_update_rate();

      for (uint i = 0; i < LZHAM_ARRAY_SIZE(m_rep_len_table); i++)
         m_rep_len_table[i].reset_update_rate();

      for (uint i = 0; i < LZHAM_ARRAY_SIZE(m_large_len_table); i++)
         m_large_len_table[i].reset_update_rate();

      m_dist_lsb_table.reset_update_rate();
   }